

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::GetProgramivActiveUniformBlockMaxNameLengthTest::initTest
          (GetProgramivActiveUniformBlockMaxNameLengthTest *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  MessageBuilder local_358;
  MessageBuilder local_1c8;
  uint local_48;
  undefined4 local_44;
  uint n_shader_id;
  uint n_shader_ids;
  GLuint shader_ids [2];
  char *vs_body;
  char *fs_body;
  bool result;
  long lStack_20;
  GLint link_status;
  Functions *gl;
  GetProgramivActiveUniformBlockMaxNameLengthTest *pGStack_10;
  GLint compile_status;
  GetProgramivActiveUniformBlockMaxNameLengthTest *this_local;
  
  gl._4_4_ = 0;
  pGStack_10 = this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  fs_body._4_4_ = 0;
  fs_body._3_1_ = 1;
  vs_body = 
  "#version 140\n\nuniform data\n{\n    vec4 temp;\n};\n\nout vec4 result;\n\nvoid main()\n{\n    result = temp;\n}\n"
  ;
  shader_ids = (GLuint  [2])anon_var_dwarf_3a1668;
  GVar2 = (**(code **)(lStack_20 + 0x3c8))();
  this->m_po_id = GVar2;
  GVar2 = (**(code **)(lStack_20 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar2;
  GVar2 = (**(code **)(lStack_20 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar2;
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glCreateProgram() / glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                  ,0x8c);
  (**(code **)(lStack_20 + 0x10))(this->m_po_id,this->m_fs_id);
  (**(code **)(lStack_20 + 0x10))(this->m_po_id,this->m_vs_id);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glAttachShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                  ,0x91);
  (**(code **)(lStack_20 + 0x12b8))(this->m_fs_id,1,&vs_body,0);
  (**(code **)(lStack_20 + 0x12b8))(this->m_vs_id,1,shader_ids,0);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glShaderSource() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                  ,0x98);
  (**(code **)(lStack_20 + 0x248))(this->m_fs_id);
  (**(code **)(lStack_20 + 0x248))(this->m_vs_id);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glCompileShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                  ,0x9d);
  n_shader_id = this->m_fs_id;
  n_shader_ids = this->m_vs_id;
  local_44 = 2;
  local_48 = 0;
  do {
    if (1 < local_48) {
      (**(code **)(lStack_20 + 0xce8))(this->m_po_id);
      dVar3 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar3,"glLinkProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0xb6);
      (**(code **)(lStack_20 + 0x9d8))(this->m_po_id,0x8b82,(long)&fs_body + 4);
      dVar3 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar3,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0xba);
      if (fs_body._4_4_ != 1) {
        pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar6 = tcu::TestContext::getLog(pTVar5);
        tcu::TestLog::operator<<(&local_358,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_358,(char (*) [24])"Program linking failure");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_358);
        fs_body._3_1_ = 0;
      }
LAB_011b3ffa:
      return (bool)(fs_body._3_1_ & 1);
    }
    (**(code **)(lStack_20 + 0xa70))((&n_shader_id)[local_48],0x8b81,(long)&gl + 4);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xa7);
    if (gl._4_4_ != 1) {
      pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar6 = tcu::TestContext::getLog(pTVar5);
      tcu::TestLog::operator<<(&local_1c8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_1c8,(char (*) [27])"Shader compilation failure");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c8);
      fs_body._3_1_ = 0;
      goto LAB_011b3ffa;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

bool GetProgramivActiveUniformBlockMaxNameLengthTest::initTest()
{
	glw::GLint			  compile_status = false;
	const glw::Functions& gl			 = m_context.getRenderContext().getFunctions();
	glw::GLint			  link_status	= false;
	bool				  result		 = true;

	const char* fs_body = "#version 140\n"
						  "\n"
						  "uniform data\n"
						  "{\n"
						  "    vec4 temp;\n"
						  "};\n"
						  "\n"
						  "out vec4 result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    result = temp;\n"
						  "}\n";

	const char* vs_body = "#version 140\n"
						  "\n"
						  "uniform data2\n"
						  "{\n"
						  "    vec4 temp2;\n"
						  "};\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = temp2;\n"
						  "}\n";

	m_po_id = gl.createProgram();
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() / glCreateShader() call(s) failed.");

	gl.attachShader(m_po_id, m_fs_id);
	gl.attachShader(m_po_id, m_vs_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	gl.shaderSource(m_fs_id, 1,			/* count */
					&fs_body, DE_NULL); /* length */
	gl.shaderSource(m_vs_id, 1,			/* count */
					&vs_body, DE_NULL); /* length */

	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call(s) failed.");

	gl.compileShader(m_fs_id);
	gl.compileShader(m_vs_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call(s) failed.");

	/* Have the shaders compiled successfully? */
	const glw::GLuint  shader_ids[] = { m_fs_id, m_vs_id };
	const unsigned int n_shader_ids = static_cast<const unsigned int>(sizeof(shader_ids) / sizeof(shader_ids[0]));

	for (unsigned int n_shader_id = 0; n_shader_id < n_shader_ids; ++n_shader_id)
	{
		gl.getShaderiv(shader_ids[n_shader_id], GL_COMPILE_STATUS, &compile_status);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		if (compile_status != GL_TRUE)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Shader compilation failure"
												<< tcu::TestLog::EndMessage;

			result = false;
			goto end;
		}
	} /* for (all shader IDs) */

	/* Link the PO */
	gl.linkProgram(m_po_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Program linking failure"
											<< tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

end:
	return result;
}